

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O2

void mbedtls_arc4_setup(mbedtls_arc4_context *ctx,uchar *key,uint keylen)

{
  uchar uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  
  ctx->x = 0;
  ctx->y = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    ctx->m[lVar2] = (uchar)lVar2;
  }
  bVar3 = 0;
  uVar4 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    if (keylen <= uVar4) {
      uVar4 = 0;
    }
    uVar1 = ctx->m[lVar2];
    bVar3 = bVar3 + uVar1 + key[uVar4];
    ctx->m[lVar2] = ctx->m[bVar3];
    ctx->m[bVar3] = uVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void mbedtls_arc4_setup( mbedtls_arc4_context *ctx, const unsigned char *key,
                 unsigned int keylen )
{
    int i, j, a;
    unsigned int k;
    unsigned char *m;

    ctx->x = 0;
    ctx->y = 0;
    m = ctx->m;

    for( i = 0; i < 256; i++ )
        m[i] = (unsigned char) i;

    j = k = 0;

    for( i = 0; i < 256; i++, k++ )
    {
        if( k >= keylen ) k = 0;

        a = m[i];
        j = ( j + a + key[k] ) & 0xFF;
        m[i] = m[j];
        m[j] = (unsigned char) a;
    }
}